

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_3a70a8::Db::parsePositiveInteger(Db *this,size_t *Out)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  
  *Out = 0;
  pcVar4 = this->First;
  pcVar1 = this->Last;
  bVar2 = true;
  if ((pcVar1 != pcVar4) && (0xf5 < (byte)(*pcVar4 - 0x3aU))) {
    sVar3 = 0;
    while ((pcVar4 != pcVar1 && ((byte)(*pcVar4 - 0x30U) < 10))) {
      *Out = sVar3 * 10;
      this->First = pcVar4 + 1;
      sVar3 = (sVar3 * 10 + (long)*pcVar4) - 0x30;
      *Out = sVar3;
      pcVar4 = pcVar4 + 1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Db::parsePositiveInteger(size_t *Out) {
  *Out = 0;
  if (look() < '0' || look() > '9')
    return true;
  while (look() >= '0' && look() <= '9') {
    *Out *= 10;
    *Out += static_cast<size_t>(consume() - '0');
  }
  return false;
}